

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O3

shared_ptr<mcc::DeclList> __thiscall mcc::Parser::DeclarationList(Parser *this)

{
  Scanner *pSVar1;
  element_type *peVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TokenType type_00;
  Parser *in_RSI;
  ErrorReporter *this_00;
  shared_ptr<mcc::DeclList> sVar6;
  shared_ptr<mcc::Expr> init;
  shared_ptr<mcc::Token> len;
  shared_ptr<mcc::Token> token;
  vector<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_>
  var_decl_list;
  Type type;
  shared_ptr<mcc::Token> name;
  bool local_f3;
  bool local_f2;
  bool local_f1;
  undefined1 local_f0 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  undefined1 local_c8 [24];
  element_type *local_b0;
  vector<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_> local_a8;
  element_type *local_88;
  Type local_80;
  ErrorReporter *local_58;
  element_type *local_48;
  element_type *local_38;
  
  local_a8.
  super__Vector_base<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8._16_8_ =
       (in_RSI->token_).super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_b0 = (element_type *)
             (in_RSI->token_).super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
  if (local_b0 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_b0->c_ = local_b0->c_ + 1;
      UNLOCK();
    }
    else {
      local_b0->c_ = local_b0->c_ + 1;
    }
  }
  local_88 = (element_type *)this;
  ParsePrim(&local_80,in_RSI);
  pSVar1 = (Scanner *)(local_f0 + 0x10);
  iVar3 = 0;
  do {
    do {
      iVar5 = iVar3;
      bVar4 = Match(in_RSI,T_STAR);
      iVar3 = iVar5 + 1;
    } while (bVar4);
    local_f0._0_8_ = pSVar1;
    local_80.ind = iVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,"Expected identifier after type declaration","");
    type_00 = (TokenType)in_RSI;
    Consume((Parser *)&stack0xffffffffffffffa0,type_00,(string *)0x30);
    if ((Scanner *)local_f0._0_8_ != pSVar1) {
      operator_delete((void *)local_f0._0_8_,
                      (ulong)((long)&(((vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>_>_>
                                        *)local_f0._16_8_)->
                                     super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 1));
    }
    bVar4 = Match(in_RSI,T_LBRACKET);
    if (bVar4) {
      local_f0._0_8_ = pSVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f0,"Expected integer length > 0","");
      Consume((Parser *)local_c8,type_00,(string *)0x2e);
      if ((Scanner *)local_f0._0_8_ != pSVar1) {
        operator_delete((void *)local_f0._0_8_,
                        (ulong)((long)&(((vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>_>_>
                                          *)local_f0._16_8_)->
                                       super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      local_f0._0_8_ = pSVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f0,"Expected \']\' after array length declaration","");
      Consume((Parser *)&stack0xffffffffffffffc0,type_00,(string *)0xc);
      if (local_38 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
      }
      if ((Scanner *)local_f0._0_8_ != pSVar1) {
        operator_delete((void *)local_f0._0_8_,
                        (ulong)((long)&(((vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>_>_>
                                          *)local_f0._16_8_)->
                                       super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      local_80.len = *(int *)((long)(ErrorReporter **)local_c8._0_8_ + 4);
      local_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_f3 = false;
      local_f1 = true;
      std::__shared_ptr<mcc::VarDecl,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<mcc::VarDecl>,std::shared_ptr<mcc::Token>&,decltype(nullptr),mcc::Type&,bool,bool>
                ((__shared_ptr<mcc::VarDecl,(__gnu_cxx::_Lock_policy)2> *)local_f0,
                 (allocator<mcc::VarDecl> *)&local_f2,
                 (shared_ptr<mcc::Token> *)&stack0xffffffffffffffa0,&local_d0._M_pi,&local_80,
                 &local_f3,&local_f1);
      std::vector<std::shared_ptr<mcc::VarDecl>,std::allocator<std::shared_ptr<mcc::VarDecl>>>::
      emplace_back<std::shared_ptr<mcc::VarDecl>>
                ((vector<std::shared_ptr<mcc::VarDecl>,std::allocator<std::shared_ptr<mcc::VarDecl>>>
                  *)&local_a8,(shared_ptr<mcc::VarDecl> *)local_f0);
      if ((ErrorReporter *)local_f0._8_8_ != (ErrorReporter *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_);
      }
      local_80.len = 0;
      this_00 = (ErrorReporter *)local_c8._8_8_;
    }
    else {
      OptionalExpression((Parser *)local_f0,type_00);
      local_f2 = false;
      local_f3 = true;
      std::__shared_ptr<mcc::VarDecl,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<mcc::VarDecl>,std::shared_ptr<mcc::Token>&,std::shared_ptr<mcc::Expr>&,mcc::Type&,bool,bool>
                ((__shared_ptr<mcc::VarDecl,(__gnu_cxx::_Lock_policy)2> *)local_c8,
                 (allocator<mcc::VarDecl> *)&local_d0,
                 (shared_ptr<mcc::Token> *)&stack0xffffffffffffffa0,
                 (shared_ptr<mcc::Expr> *)local_f0,&local_80,&local_f2,&local_f3);
      std::vector<std::shared_ptr<mcc::VarDecl>,std::allocator<std::shared_ptr<mcc::VarDecl>>>::
      emplace_back<std::shared_ptr<mcc::VarDecl>>
                ((vector<std::shared_ptr<mcc::VarDecl>,std::allocator<std::shared_ptr<mcc::VarDecl>>>
                  *)&local_a8,(shared_ptr<mcc::VarDecl> *)local_c8);
      this_00 = (ErrorReporter *)local_f0._8_8_;
      if ((ErrorReporter *)local_c8._8_8_ != (ErrorReporter *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
        this_00 = (ErrorReporter *)local_f0._8_8_;
      }
    }
    if (this_00 != (ErrorReporter *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
    if (local_58 != (ErrorReporter *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58);
    }
    bVar4 = Match(in_RSI,T_COMMA);
    iVar3 = 0;
  } while (bVar4);
  local_f0._0_8_ = pSVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"Expected \';\' after variable declaration","");
  Consume((Parser *)&stack0xffffffffffffffb0,type_00,(string *)0x6);
  if (local_48 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
  }
  if ((Scanner *)local_f0._0_8_ != pSVar1) {
    operator_delete((void *)local_f0._0_8_,
                    (ulong)((long)&(((vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>_>_>
                                      *)local_f0._16_8_)->
                                   super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::Entry>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 1));
  }
  peVar2 = local_88;
  std::__shared_ptr<mcc::DeclList,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<mcc::DeclList>,std::shared_ptr<mcc::Token>,std::vector<std::shared_ptr<mcc::VarDecl>,std::allocator<std::shared_ptr<mcc::VarDecl>>>&>
            ((__shared_ptr<mcc::DeclList,(__gnu_cxx::_Lock_policy)2> *)local_88,
             (allocator<mcc::DeclList> *)local_f0,(shared_ptr<mcc::Token> *)(local_c8 + 0x10),
             &local_a8);
  if (local_80.name.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.name.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_b0 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0);
  }
  std::vector<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_>::
  ~vector(&local_a8);
  sVar6.super___shared_ptr<mcc::DeclList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar6.super___shared_ptr<mcc::DeclList,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  return (shared_ptr<mcc::DeclList>)
         sVar6.super___shared_ptr<mcc::DeclList,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<DeclList> Parser::DeclarationList() {
  std::vector<std::shared_ptr<VarDecl>> var_decl_list;
  std::shared_ptr<Token> token = Peek();
  Type type = ParsePrim();

  do {
    ParsePtr(type);
    std::shared_ptr<Token> name = Consume(TokenType::T_IDENTIFIER,"Expected identifier after type declaration");
    if (Match(TokenType::T_LBRACKET)) {
      std::shared_ptr<Token> len = Consume(TokenType::T_INT_LIT, "Expected integer length > 0");
      Consume(TokenType::T_RBRACKET, "Expected ']' after array length declaration");
      type.len = len->Int();
      var_decl_list.push_back(std::make_shared<VarDecl>(name, nullptr, type, false, true));
      type.len = 0;
    } else {
      std::shared_ptr<Expr> init = OptionalExpression(0);
      var_decl_list.push_back(std::make_shared<VarDecl>(name, init, type, false, true));
    }
  } while (Match(TokenType::T_COMMA));

  Consume(TokenType::T_SEMICOLON, "Expected ';' after variable declaration");
  return std::make_shared<DeclList>(std::move(token), var_decl_list);
}